

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O3

optional<tinyusdz::value::quatf> * __thiscall
tinyusdz::primvar::PrimVar::get_value<tinyusdz::value::quatf>
          (optional<tinyusdz::value::quatf> *__return_storage_ptr__,PrimVar *this)

{
  vtable_type *pvVar1;
  uint32_t uVar2;
  bool bVar3;
  optional<tinyusdz::value::quatf> local_2c;
  
  pvVar1 = (this->_value).v_.vtable;
  if (pvVar1 == (vtable_type *)0x0) {
    bVar3 = false;
  }
  else {
    uVar2 = (*pvVar1->type_id)();
    bVar3 = uVar2 == 4;
  }
  if (((bVar3) || ((this->_blocked & 1U) != 0)) ||
     ((pvVar1 = (this->_value).v_.vtable, pvVar1 != (vtable_type *)0x0 &&
      ((uVar2 = (*pvVar1->type_id)(), uVar2 == 0 ||
       ((pvVar1 = (this->_value).v_.vtable, pvVar1 != (vtable_type *)0x0 &&
        (uVar2 = (*pvVar1->type_id)(), uVar2 == 1)))))))) {
    __return_storage_ptr__->has_value_ = false;
    local_2c.contained.data.__align = (anon_struct_4_0_00000001_for___align)0x0;
    local_2c.contained._4_4_ = 0;
    local_2c.contained._8_4_ = 0;
    local_2c.contained._12_4_ = 0;
  }
  else {
    tinyusdz::value::Value::get_value<tinyusdz::value::quatf>(&local_2c,&this->_value,false);
    __return_storage_ptr__->has_value_ = local_2c.has_value_;
    if (local_2c.has_value_ != true) {
      return __return_storage_ptr__;
    }
  }
  *(undefined4 *)&__return_storage_ptr__->contained = local_2c.contained.data.__align;
  *(undefined4 *)((long)&__return_storage_ptr__->contained + 4) = local_2c.contained._4_4_;
  *(undefined4 *)((long)&__return_storage_ptr__->contained + 8) = local_2c.contained._8_4_;
  *(undefined4 *)((long)&__return_storage_ptr__->contained + 0xc) = local_2c.contained._12_4_;
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_value() const {

    if (is_blocked()) {
      return nonstd::nullopt;
    }

    if (!has_default()) {
      return nonstd::nullopt;
    }

    return _value.get_value<T>();
  }